

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall
OpenMD::ZConstraintForceModifier::ZConstraintForceModifier
          (ZConstraintForceModifier *this,SimInfo *info)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *pSVar2;
  double *pdVar3;
  double *pdVar4;
  double *__b;
  size_t sVar5;
  ZConsWriter *pZVar6;
  SimInfo *in_RSI;
  ZConstraintForceModifier *in_RDI;
  RealType RVar7;
  __enable_if_t<is_constructible<value_type,_pair<int,_ZconstraintParam>_>::value,_pair<iterator,_bool>_>
  _Var8;
  iterator j;
  int zmolIndex;
  ZconstraintParam param;
  int i;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  int nZconstraints;
  RealType zforceConstant;
  RealType targetTemp;
  RealType halfOfLargestBox;
  Mat3x3d hmat;
  Globals *simParam;
  Globals *in_stack_fffffffffffffcd8;
  errorStruct *peVar9;
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  Molecule *in_stack_fffffffffffffcf0;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *this_01;
  undefined8 in_stack_fffffffffffffcf8;
  ZConstraintForceModifier *in_stack_fffffffffffffd00;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::ZconstraintParam>_> in_stack_fffffffffffffd10;
  map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
  *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  ZConsWriter *in_stack_fffffffffffffd30;
  undefined1 local_199 [33];
  Molecule **local_178;
  Molecule **local_170;
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  local_168;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::ZconstraintParam>_> in_stack_fffffffffffffea0;
  int local_10c;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> local_108;
  int local_ec;
  ZConsWriter *local_e8;
  double local_e0;
  double local_d8;
  RectMatrix<double,_3U,_3U> local_d0;
  string local_88 [32];
  string local_68 [32];
  string local_48 [48];
  Globals *local_18;
  
  ForceModifier::ForceModifier(&in_RDI->super_ForceModifier,in_RSI);
  (in_RDI->super_ForceModifier)._vptr_ForceModifier =
       (_func_int **)&PTR__ZConstraintForceModifier_0050a160;
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x3248a7);
  std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::list
            ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)0x3248c0);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::vector
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)0x3248d9);
  std::__cxx11::string::string((string *)&in_RDI->zconsOutput_);
  std::
  map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
  ::map((map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
         *)0x32490e);
  in_RDI->infiniteTime = 1e+31;
  local_18 = SimInfo::getSimParams((in_RDI->super_ForceModifier).info_);
  this_00 = SimInfo::getSnapshotManager((in_RDI->super_ForceModifier).info_);
  pSVar2 = SnapshotManager::getCurrentSnapshot(this_00);
  in_RDI->currSnapshot_ = pSVar2;
  RVar7 = Snapshot::getTime(in_RDI->currSnapshot_);
  in_RDI->currZconsTime_ = RVar7;
  bVar1 = Globals::haveDt((Globals *)0x3249d0);
  if (bVar1) {
    RVar7 = Globals::getDt((Globals *)0x3249f3);
    in_RDI->dt_ = RVar7;
  }
  else {
    snprintf(painCave.errMsg,2000,"ZconstraintForceManager Error: dt is not set\n");
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = Globals::haveZconsTime((Globals *)0x324a7c);
  if (bVar1) {
    RVar7 = Globals::getZconsTime((Globals *)0x324a9f);
    in_RDI->zconsTime_ = RVar7;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "ZconstraintForceManager error: If you use a ZConstraint,\n\tyou must set zconsTime.\n"
            );
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = Globals::haveZconsTol((Globals *)0x324b0c);
  if (bVar1) {
    RVar7 = Globals::getZconsTol((Globals *)0x324b2f);
    in_RDI->zconsTol_ = RVar7;
  }
  else {
    in_RDI->zconsTol_ = 0.01;
    snprintf(painCave.errMsg,2000,
             "ZconstraintForceManager Warning: Tolerance for z-constraint method is not specified.\n\tOpenMD will use a default value of %f.\n\tTo set the tolerance, use the zconsTol variable.\n"
             ,in_RDI->zconsTol_);
    painCave.isFatal = 0;
    simError();
  }
  bVar1 = Globals::haveZconsGap((Globals *)0x324bc0);
  if (bVar1) {
    in_RDI->usingZconsGap_ = true;
    RVar7 = Globals::getZconsGap((Globals *)0x324bf2);
    in_RDI->zconsGap_ = RVar7;
  }
  else {
    in_RDI->usingZconsGap_ = false;
    in_RDI->zconsGap_ = 0.0;
  }
  bVar1 = Globals::haveZconsFixtime((Globals *)0x324c3f);
  if (bVar1) {
    RVar7 = Globals::getZconsFixtime((Globals *)0x324c62);
    in_RDI->zconsFixingTime_ = RVar7;
  }
  else {
    in_RDI->zconsFixingTime_ = in_RDI->infiniteTime;
  }
  bVar1 = Globals::haveZconsUsingSMD((Globals *)0x324cad);
  if (bVar1) {
    bVar1 = Globals::getZconsUsingSMD((Globals *)0x324cd0);
    in_RDI->usingSMD_ = bVar1;
  }
  else {
    in_RDI->usingSMD_ = false;
  }
  SimInfo::getFinalConfigFileName_abi_cxx11_((SimInfo *)in_stack_fffffffffffffcd8);
  getPrefix(in_stack_fffffffffffffce8);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::__cxx11::string::operator=((string *)&in_RDI->zconsOutput_,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  Snapshot::getHmat((Snapshot *)in_stack_fffffffffffffcd8);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_d0,0,0);
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_d0,1,1);
  __b = RectMatrix<double,_3U,_3U>::operator()(&local_d0,2,2);
  pdVar4 = std::max<double>(pdVar4,__b);
  pdVar3 = std::max<double>(pdVar3,pdVar4);
  local_d8 = *pdVar3 * 0.5;
  bVar1 = Globals::haveTargetTemp((Globals *)0x324e7b);
  if (bVar1) {
    local_e0 = Globals::getTargetTemp((Globals *)0x324ea1);
  }
  else {
    local_e0 = 298.0;
  }
  local_e8 = (ZConsWriter *)((local_e0 * 0.0019872156) / (local_d8 * local_d8));
  sVar5 = Globals::getNZconsStamps((Globals *)0x324f6f);
  local_ec = (int)sVar5;
  Globals::getZconsStamps(in_stack_fffffffffffffcd8);
  for (local_10c = 0; local_10c < local_ec; local_10c = local_10c + 1) {
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
              (&local_108,(long)local_10c);
    ZConsStamp::getMolIndex((ZConsStamp *)0x324fdb);
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
              (&local_108,(long)local_10c);
    bVar1 = ZConsStamp::haveZpos((ZConsStamp *)0x325009);
    if (bVar1) {
      std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
                (&local_108,(long)local_10c);
      ZConsStamp::getZpos((ZConsStamp *)0x325036);
    }
    else {
      getZTargetPos(in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
    }
    in_stack_fffffffffffffd30 = local_e8;
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
              (&local_108,(long)local_10c);
    ZConsStamp::getKratio((ZConsStamp *)0x3250bf);
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
              (&local_108,(long)local_10c);
    in_stack_fffffffffffffd2f = ZConsStamp::haveCantVel((ZConsStamp *)0x3250fd);
    if ((bool)in_stack_fffffffffffffd2f) {
      std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
                (&local_108,(long)local_10c);
      in_stack_fffffffffffffd20 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ZConsStamp::getCantVel((ZConsStamp *)0x32512a);
    }
    in_stack_fffffffffffffd18 = &in_RDI->allZMolIndices_;
    std::make_pair<int&,OpenMD::ZconstraintParam&>
              ((int *)in_stack_fffffffffffffce0,(ZconstraintParam *)in_stack_fffffffffffffcd8);
    _Var8 = std::
            map<int,OpenMD::ZconstraintParam,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZconstraintParam>>>
            ::insert<std::pair<int,OpenMD::ZconstraintParam>>
                      ((map<int,_OpenMD::ZconstraintParam,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
                        *)in_stack_fffffffffffffcf0,
                       (pair<int,_OpenMD::ZconstraintParam> *)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffd10 = _Var8.first._M_node;
    in_stack_fffffffffffffea0._M_node = in_stack_fffffffffffffd10._M_node;
  }
  update((ZConstraintForceModifier *)in_stack_fffffffffffffea0._M_node);
  in_RDI->totMassUnconsMols_ = 0.0;
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  ::__normal_iterator(&local_168);
  local_170 = (Molecule **)
              std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::begin
                        ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                         in_stack_fffffffffffffcd8);
  local_168._M_current = local_170;
  while( true ) {
    local_178 = (Molecule **)
                std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::end
                          ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                           in_stack_fffffffffffffcd8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffce0,
                       (__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffcd8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator*(&local_168);
    RVar7 = Molecule::getMass(in_stack_fffffffffffffcf0);
    in_RDI->totMassUnconsMols_ = RVar7 + in_RDI->totMassUnconsMols_;
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator++(&local_168);
  }
  zeroVelocity(in_RDI);
  pZVar6 = (ZConsWriter *)operator_new(0x208);
  std::__cxx11::string::c_str();
  this_01 = (vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *)local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
             (allocator<char> *)in_stack_fffffffffffffd10._M_node);
  ZConsWriter::ZConsWriter
            (in_stack_fffffffffffffd30,
             (SimInfo *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             in_stack_fffffffffffffd20);
  in_RDI->fzOut = pZVar6;
  std::__cxx11::string::~string((string *)(local_199 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_199);
  if (in_RDI->fzOut == (ZConsWriter *)0x0) {
    peVar9 = &painCave;
    snprintf(painCave.errMsg,2000,"ZconstraintForceManager:: Failed to create ZConsWriter\n");
    peVar9->isFatal = 1;
    simError();
  }
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~vector(this_01);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x325429);
  return;
}

Assistant:

ZConstraintForceModifier::ZConstraintForceModifier(SimInfo* info) :
      ForceModifier {info}, infiniteTime {1e31} {
    Globals* simParam = info_->getSimParams();
    currSnapshot_     = info_->getSnapshotManager()->getCurrentSnapshot();
    currZconsTime_    = currSnapshot_->getTime();

    if (simParam->haveDt()) {
      dt_ = simParam->getDt();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTime()) {
      zconsTime_ = simParam->getZconsTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager error: If you use a ZConstraint,\n"
               "\tyou must set zconsTime.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTol()) {
      zconsTol_ = simParam->getZconsTol();
    } else {
      zconsTol_ = 0.01;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager Warning: Tolerance for z-constraint "
               "method is not specified.\n"
               "\tOpenMD will use a default value of %f.\n"
               "\tTo set the tolerance, use the zconsTol variable.\n",
               zconsTol_);
      painCave.isFatal = 0;
      simError();
    }

    // set zcons gap
    if (simParam->haveZconsGap()) {
      usingZconsGap_ = true;
      zconsGap_      = simParam->getZconsGap();
    } else {
      usingZconsGap_ = false;
      zconsGap_      = 0.0;
    }

    // set zcons fixtime
    if (simParam->haveZconsFixtime()) {
      zconsFixingTime_ = simParam->getZconsFixtime();
    } else {
      zconsFixingTime_ = infiniteTime;
    }

    // set zconsUsingSMD
    if (simParam->haveZconsUsingSMD()) {
      usingSMD_ = simParam->getZconsUsingSMD();
    } else {
      usingSMD_ = false;
    }

    zconsOutput_ = getPrefix(info_->getFinalConfigFileName()) + ".fz";

    // estimate the force constant of harmonical potential
    Mat3x3d hmat = currSnapshot_->getHmat();
    RealType halfOfLargestBox =
        std::max(hmat(0, 0), std::max(hmat(1, 1), hmat(2, 2))) / 2;
    RealType targetTemp;
    if (simParam->haveTargetTemp()) {
      targetTemp = simParam->getTargetTemp();
    } else {
      targetTemp = 298.0;
    }
    RealType zforceConstant =
        Constants::kb * targetTemp / (halfOfLargestBox * halfOfLargestBox);

    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();

    for (int i = 0; i < nZconstraints; i++) {
      ZconstraintParam param;
      int zmolIndex = stamp[i]->getMolIndex();
      if (stamp[i]->haveZpos()) {
        param.zTargetPos = stamp[i]->getZpos();
      } else {
        param.zTargetPos = getZTargetPos(zmolIndex);
      }

      param.kz = zforceConstant * stamp[i]->getKratio();

      if (stamp[i]->haveCantVel()) {
        param.cantVel = stamp[i]->getCantVel();
      } else {
        param.cantVel = 0.0;
      }

      allZMolIndices_.insert(std::make_pair(zmolIndex, param));
    }

    // create fixedMols_, movingMols_ and unconsMols lists
    update();

    // calculate mass of unconstrained molecules in the whole system
    // (never changes during the simulation)

    totMassUnconsMols_ = 0.0;
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      totMassUnconsMols_ += (*j)->getMass();
    }
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &totMassUnconsMols_, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // Zero out the velocities of center of mass of unconstrained
    // molecules and the velocities of center of mass of every single
    // z-constrained molecueles
    zeroVelocity();

    // create zconsWriter
    fzOut = new ZConsWriter(info_, zconsOutput_.c_str());

    if (!fzOut) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager:: Failed to create ZConsWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }